

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O0

void * wpe_load_object(char *object_name)

{
  void *object;
  char *object_name_local;
  
  if (s_impl_library == (void *)0x0) {
    load_impl_library();
  }
  if (s_impl_loader == (wpe_loader_interface *)0x0) {
    object_name_local = (char *)dlsym(s_impl_library,object_name);
    if (object_name_local == (char *)0x0) {
      fprintf(_stderr,"wpe_load_object: failed to load object with name \'%s\'\n",object_name);
    }
  }
  else {
    if (s_impl_loader->load_object == (_func_void_ptr_char_ptr *)0x0) {
      fprintf(_stderr,
              "wpe_load_object: failed to load object with name \'%s\': backend doesn\'t implement load_object vfunc\n"
              ,object_name);
      abort();
    }
    object_name_local = (char *)(*s_impl_loader->load_object)(object_name);
  }
  return object_name_local;
}

Assistant:

void*
wpe_load_object(const char* object_name)
{
    if (!s_impl_library)
        load_impl_library();

    if (s_impl_loader) {
        if (!s_impl_loader->load_object) {
            fprintf(stderr, "wpe_load_object: failed to load object with name '%s': backend doesn't implement load_object vfunc\n", object_name);
            abort();
        }
        return s_impl_loader->load_object(object_name);
    }

    void* object = dlsym(s_impl_library, object_name);
    if (!object)
        fprintf(stderr, "wpe_load_object: failed to load object with name '%s'\n", object_name);

    return object;
}